

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_expand_vec_op_s390x
               (TCGContext_conflict12 *tcg_ctx,TCGOpcode opc,TCGType type,uint vece,TCGArg a0,...)

{
  TCGTemp *pTVar1;
  long lVar2;
  _Bool _Var3;
  TCGv_vec pTVar4;
  TCGv_vec r;
  TCGv_vec pTVar5;
  int line;
  int64_t i;
  TCGArg i_00;
  uintptr_t o_8;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_vec pTVar6;
  uintptr_t o_7;
  TCGTemp *ts;
  uintptr_t o_2;
  long lVar7;
  TCGArg in_stack_00000008;
  TCGCond TStack0000000000000010;
  long in_stack_00000018;
  TCGCond in_stack_00000020;
  va_list va;
  TCGTemp *local_110;
  TCGArg local_c0;
  
  if (opc - INDEX_op_shli_vec < 0xc) {
    pTVar5 = (TCGv_vec)(a0 - (long)tcg_ctx);
    pTVar6 = (TCGv_vec)(local_c0 - (long)tcg_ctx);
    switch(opc) {
    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
      pTVar5 = tcg_temp_new_vec_s390x(tcg_ctx,type);
      pTVar6 = tcg_temp_new_vec_s390x(tcg_ctx,type);
      pTVar1 = (TCGTemp *)(pTVar5 + (long)&tcg_ctx->pool_cur);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar1,local_c0,local_c0);
      ts = (TCGTemp *)(pTVar6 + (long)&tcg_ctx->pool_cur);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)ts,local_c0,local_c0);
      i = in_stack_00000008 + 8;
      if (opc != INDEX_op_shri_vec) {
        tcg_gen_shli_vec_s390x(tcg_ctx,1,pTVar5,pTVar5,i);
        tcg_gen_shli_vec_s390x(tcg_ctx,1,pTVar6,pTVar6,i);
        i = 8;
      }
      tcg_gen_shri_vec_s390x(tcg_ctx,1,pTVar5,pTVar5,i);
      tcg_gen_shri_vec_s390x(tcg_ctx,1,pTVar6,pTVar6,i);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_packus_vec,type,0,a0,(TCGArg)pTVar1,(TCGArg)ts);
      tcg_temp_free_internal_s390x(tcg_ctx,pTVar1);
      break;
    case INDEX_op_sari_vec:
      if (vece == 3) {
        if (in_stack_00000008 < 0x21) {
          pTVar4 = tcg_temp_new_vec_s390x(tcg_ctx,type);
          i_00 = 0x1f;
          if (in_stack_00000008 < 0x1f) {
            i_00 = in_stack_00000008;
          }
          tcg_gen_sari_vec_s390x(tcg_ctx,2,pTVar4,pTVar6,i_00);
          tcg_gen_shri_vec_s390x(tcg_ctx,3,pTVar5,pTVar6,in_stack_00000008);
          ts = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
          vec_gen_4_s390x(tcg_ctx,INDEX_op_x86_blend_vec,type,2,a0,a0,(TCGArg)ts,0xaa);
        }
        else {
          pTVar4 = tcg_const_zeros_vec_s390x(tcg_ctx,type);
          tcg_gen_cmp_vec_s390x(tcg_ctx,TCG_COND_GT,3,pTVar4,pTVar4,pTVar6);
          tcg_gen_shri_vec_s390x(tcg_ctx,3,pTVar5,pTVar6,in_stack_00000008);
          tcg_gen_shli_vec_s390x(tcg_ctx,3,pTVar4,pTVar4,0x40 - in_stack_00000008);
          tcg_gen_or_vec_s390x(tcg_ctx,3,pTVar5,pTVar5,pTVar4);
          ts = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
        }
      }
      else {
        if (vece != 0) {
          line = 0xd3c;
          goto LAB_00ac6dc0;
        }
        pTVar5 = tcg_temp_new_vec_s390x(tcg_ctx,type);
        pTVar6 = tcg_temp_new_vec_s390x(tcg_ctx,type);
        pTVar1 = (TCGTemp *)(pTVar5 + (long)&tcg_ctx->pool_cur);
        vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar1,local_c0,local_c0);
        ts = (TCGTemp *)(pTVar6 + (long)&tcg_ctx->pool_cur);
        vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)ts,local_c0,local_c0);
        tcg_gen_sari_vec_s390x(tcg_ctx,1,pTVar5,pTVar5,in_stack_00000008 + 8);
        tcg_gen_sari_vec_s390x(tcg_ctx,1,pTVar6,pTVar6,in_stack_00000008 + 8);
        vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_packss_vec,type,0,a0,(TCGArg)pTVar1,(TCGArg)ts);
        tcg_temp_free_internal_s390x(tcg_ctx,pTVar1);
      }
      break;
    default:
      goto switchD_00ac66a0_caseD_a6;
    case INDEX_op_cmp_vec:
      _Var3 = expand_vec_cmp_noinv
                        (tcg_ctx,type,vece,pTVar5,pTVar6,
                         (TCGv_vec)(in_stack_00000008 - (long)tcg_ctx),TStack0000000000000010);
      if (!_Var3) {
        return;
      }
      tcg_gen_not_vec_s390x(tcg_ctx,vece,pTVar5,pTVar5);
      return;
    case INDEX_op_cmpsel_vec:
      pTVar5 = tcg_temp_new_vec_s390x(tcg_ctx,type);
      _Var3 = expand_vec_cmp_noinv
                        (tcg_ctx,type,vece,pTVar5,pTVar6,
                         (TCGv_vec)(in_stack_00000008 - (long)tcg_ctx),in_stack_00000020);
      lVar7 = _TStack0000000000000010 - (long)tcg_ctx;
      lVar2 = in_stack_00000018 - (long)tcg_ctx;
      if (_Var3) {
        lVar7 = in_stack_00000018 - (long)tcg_ctx;
        lVar2 = _TStack0000000000000010 - (long)tcg_ctx;
      }
      ts = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
      vec_gen_4_s390x(tcg_ctx,INDEX_op_x86_vpblendvb_vec,type,vece,a0,
                      (long)&tcg_ctx->pool_cur + lVar2,(long)&tcg_ctx->pool_cur + lVar7,(TCGArg)ts);
    }
  }
  else {
    if (opc != INDEX_op_mul_vec) {
      return;
    }
    if (type - TCG_TYPE_V128 < 2) {
      pTVar5 = tcg_temp_new_vec_s390x(tcg_ctx,type);
      pTVar6 = tcg_temp_new_vec_s390x(tcg_ctx,type);
      pTVar4 = tcg_temp_new_vec_s390x(tcg_ctx,type);
      r = tcg_temp_new_vec_s390x(tcg_ctx,type);
      tcg_gen_dup16i_vec_s390x(tcg_ctx,r,0);
      pTVar1 = (TCGTemp *)(pTVar5 + (long)&tcg_ctx->pool_cur);
      ts = (TCGTemp *)(r + (long)&tcg_ctx->pool_cur);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,(TCGArg)pTVar1,local_c0,(TCGArg)ts);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckl_vec,type,0,
                      (TCGArg)(pTVar6 + (long)&tcg_ctx->pool_cur),(TCGArg)ts,in_stack_00000008);
      local_110 = (TCGTemp *)(pTVar4 + (long)&tcg_ctx->pool_cur);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)local_110,local_c0,(TCGArg)ts)
      ;
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckh_vec,type,0,(TCGArg)ts,(TCGArg)ts,
                      in_stack_00000008);
      tcg_gen_mul_vec_s390x(tcg_ctx,1,pTVar5,pTVar5,pTVar6);
      tcg_gen_mul_vec_s390x(tcg_ctx,1,pTVar4,pTVar4,r);
      tcg_gen_shri_vec_s390x(tcg_ctx,1,pTVar5,pTVar5,8);
      tcg_gen_shri_vec_s390x(tcg_ctx,1,pTVar4,pTVar4,8);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_packus_vec,type,0,a0,(TCGArg)pTVar1,(TCGArg)local_110);
      tcg_temp_free_internal_s390x(tcg_ctx,pTVar1);
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar6 + (long)&tcg_ctx->pool_cur));
    }
    else {
      if (type != TCG_TYPE_V64) {
        line = 0xd7e;
LAB_00ac6dc0:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                   ,line,(char *)0x0);
      }
      pTVar5 = tcg_temp_new_vec_s390x(tcg_ctx,TCG_TYPE_V128);
      pTVar6 = tcg_temp_new_vec_s390x(tcg_ctx,TCG_TYPE_V128);
      tcg_gen_dup16i_vec_s390x(tcg_ctx,pTVar6,0);
      local_110 = (TCGTemp *)(pTVar5 + (long)&tcg_ctx->pool_cur);
      ts = (TCGTemp *)(pTVar6 + (long)&tcg_ctx->pool_cur);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckl_vec,TCG_TYPE_V128,0,(TCGArg)local_110,local_c0,
                      (TCGArg)ts);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_punpckl_vec,TCG_TYPE_V128,0,(TCGArg)ts,(TCGArg)ts,
                      in_stack_00000008);
      tcg_gen_mul_vec_s390x(tcg_ctx,1,pTVar5,pTVar5,pTVar6);
      tcg_gen_shri_vec_s390x(tcg_ctx,1,pTVar5,pTVar5,8);
      vec_gen_3_s390x(tcg_ctx,INDEX_op_x86_packus_vec,TCG_TYPE_V128,0,a0,(TCGArg)local_110,
                      (TCGArg)local_110);
    }
    tcg_temp_free_internal_s390x(tcg_ctx,local_110);
  }
  tcg_temp_free_internal_s390x(tcg_ctx,ts);
switchD_00ac66a0_caseD_a6:
  return;
}

Assistant:

void tcg_expand_vec_op(TCGContext *tcg_ctx, TCGOpcode opc, TCGType type, unsigned vece,
                       TCGArg a0, ...)
{
    va_list va;
    TCGArg a2;
    TCGv_vec v0, v1, v2, v3, v4;

    va_start(va, a0);
    v0 = temp_tcgv_vec(tcg_ctx, arg_temp(a0));
    v1 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
    a2 = va_arg(va, TCGArg);

    switch (opc) {
    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
        expand_vec_shi(tcg_ctx, type, vece, opc == INDEX_op_shri_vec, v0, v1, a2);
        break;

    case INDEX_op_sari_vec:
        expand_vec_sari(tcg_ctx, type, vece, v0, v1, a2);
        break;

    case INDEX_op_mul_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        expand_vec_mul(tcg_ctx, type, vece, v0, v1, v2);
        break;

    case INDEX_op_cmp_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        expand_vec_cmp(tcg_ctx, type, vece, v0, v1, v2, va_arg(va, TCGArg));
        break;

    case INDEX_op_cmpsel_vec:
        v2 = temp_tcgv_vec(tcg_ctx, arg_temp(a2));
        v3 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
        v4 = temp_tcgv_vec(tcg_ctx, arg_temp(va_arg(va, TCGArg)));
        expand_vec_cmpsel(tcg_ctx, type, vece, v0, v1, v2, v3, v4, va_arg(va, TCGArg));
        break;

    default:
        break;
    }

    va_end(va);
}